

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::Texture2DArrayView::sampleCompare
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int z_;
  float fVar1;
  Vector<int,_3> local_38;
  float local_2c;
  float local_28;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  Texture2DArrayView *this_local;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_2c = lod;
  local_28 = r;
  lod_local = t;
  r_local = s;
  t_local = ref;
  _s_local = sampler;
  sampler_local = (Sampler *)this;
  z_ = selectLayer(this,r);
  Vector<int,_3>::Vector(&local_38,0,0,z_);
  fVar1 = sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s,t,lod,&local_38);
  return fVar1;
}

Assistant:

float Texture2DArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float lod) const
{
	return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, s, t, lod, IVec3(0, 0, selectLayer(r)));
}